

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::ForLoopStatementSyntax::getChildPtr(ForLoopStatementSyntax *this,size_t index)

{
  undefined8 in_RSI;
  long in_RDI;
  SyntaxNode *in_stack_ffffffffffffff98;
  PtrTokenOrSyntax *in_stack_ffffffffffffffa0;
  PtrTokenOrSyntax *local_10;
  
  switch(in_RSI) {
  case 0:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 1:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 2:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,(Token *)in_stack_ffffffffffffff98)
    ;
    break;
  case 3:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,(Token *)in_stack_ffffffffffffff98)
    ;
    break;
  case 4:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 5:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,(Token *)in_stack_ffffffffffffff98)
    ;
    break;
  case 6:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 7:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,(Token *)in_stack_ffffffffffffff98)
    ;
    break;
  case 8:
    PtrTokenOrSyntax::PtrTokenOrSyntax
              ((PtrTokenOrSyntax *)(in_RDI + 0xd8),in_stack_ffffffffffffff98);
    break;
  case 9:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,(Token *)in_stack_ffffffffffffff98)
    ;
    break;
  case 10:
    not_null<slang::syntax::StatementSyntax_*>::get
              ((not_null<slang::syntax::StatementSyntax_*> *)(in_RDI + 0x120));
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  default:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax ForLoopStatementSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return &forKeyword;
        case 3: return &openParen;
        case 4: return &initializers;
        case 5: return &semi1;
        case 6: return stopExpr;
        case 7: return &semi2;
        case 8: return &steps;
        case 9: return &closeParen;
        case 10: return statement.get();
        default: return nullptr;
    }
}